

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawPolyLinesEx(Vector2 center,int sides,float radius,float rotation,float lineThick,
                    Color color)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  bool bVar4;
  float fVar5;
  float __x;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 local_a0;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 local_58;
  undefined4 uStack_54;
  
  iVar3 = 3;
  if (3 < sides) {
    iVar3 = sides;
  }
  fVar8 = (360.0 / (float)iVar3) * 0.017453292;
  fVar5 = cosf(fVar8 * 0.017453292 * 0.5);
  fVar5 = radius - fVar5 * lineThick;
  rlSetTexture(texShapes.id);
  uVar2 = texShapesRec._8_8_;
  uVar1 = texShapesRec._0_8_;
  rlBegin(7);
  local_58 = (float)uVar1;
  uStack_54 = SUB84(uVar1,4);
  local_78 = (float)uVar2;
  uStack_74 = SUB84(uVar2,4);
  uStack_84 = center.y;
  local_a0 = rotation * 0.017453292;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    rlColor4ub(color.r,color.g,color.b,color.a);
    __x = fVar8 + local_a0;
    rlTexCoord2f(local_58 / (float)texShapes.width,(uStack_74 + uStack_54) / (float)texShapes.height
                );
    fVar6 = cosf(local_a0);
    local_88 = center.x;
    fVar7 = sinf(local_a0);
    rlVertex2f(fVar6 * radius + local_88,fVar7 * radius + uStack_84);
    rlTexCoord2f(local_58 / (float)texShapes.width,uStack_54 / (float)texShapes.height);
    fVar6 = cosf(local_a0);
    fVar7 = sinf(local_a0);
    rlVertex2f(fVar6 * fVar5 + local_88,fVar7 * fVar5 + uStack_84);
    rlTexCoord2f((local_78 + local_58) / (float)texShapes.width,
                 (uStack_74 + uStack_54) / (float)texShapes.height);
    fVar6 = cosf(__x);
    fVar7 = sinf(__x);
    rlVertex2f(fVar6 * fVar5 + local_88,fVar7 * fVar5 + uStack_84);
    rlTexCoord2f((local_78 + local_58) / (float)texShapes.width,uStack_54 / (float)texShapes.height)
    ;
    fVar6 = cosf(__x);
    fVar7 = sinf(__x);
    rlVertex2f(fVar6 * radius + local_88,fVar7 * radius + uStack_84);
    local_a0 = __x;
  }
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawPolyLinesEx(Vector2 center, int sides, float radius, float rotation, float lineThick, Color color)
{
    if (sides < 3) sides = 3;
    float centralAngle = rotation*DEG2RAD;
    float exteriorAngle = 360.0f/(float)sides*DEG2RAD;
    float innerRadius = radius - (lineThick*cosf(DEG2RAD*exteriorAngle/2.0f));

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlSetTexture(GetShapesTexture().id);
    Rectangle shapeRect = GetShapesTextureRectangle();

    rlBegin(RL_QUADS);
        for (int i = 0; i < sides; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);
            float nextAngle = centralAngle + exteriorAngle;

            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(centralAngle)*radius, center.y + sinf(centralAngle)*radius);

            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x + cosf(centralAngle)*innerRadius, center.y + sinf(centralAngle)*innerRadius);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(center.x + cosf(nextAngle)*innerRadius, center.y + sinf(nextAngle)*innerRadius);

            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(center.x + cosf(nextAngle)*radius, center.y + sinf(nextAngle)*radius);

            centralAngle = nextAngle;
        }
    rlEnd();
    rlSetTexture(0);
#else
    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < sides; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);
            float nextAngle = centralAngle + exteriorAngle;

            rlVertex2f(center.x + cosf(nextAngle)*radius, center.y + sinf(nextAngle)*radius);
            rlVertex2f(center.x + cosf(centralAngle)*radius, center.y + sinf(centralAngle)*radius);
            rlVertex2f(center.x + cosf(centralAngle)*innerRadius, center.y + sinf(centralAngle)*innerRadius);

            rlVertex2f(center.x + cosf(centralAngle)*innerRadius, center.y + sinf(centralAngle)*innerRadius);
            rlVertex2f(center.x + cosf(nextAngle)*innerRadius, center.y + sinf(nextAngle)*innerRadius);
            rlVertex2f(center.x + cosf(nextAngle)*radius, center.y + sinf(nextAngle)*radius);

            centralAngle = nextAngle;
        }
    rlEnd();
#endif
}